

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_file.cpp
# Opt level: O0

void Omega_h::binary::read_sets(istream *stream,Mesh *mesh,bool needs_swapping)

{
  mapped_type *this;
  value_type local_64;
  ClassPair pair;
  I32 j;
  I32 npairs;
  string local_48 [8];
  string name;
  int local_24;
  int local_20;
  I32 i;
  I32 n;
  bool needs_swapping_local;
  Mesh *mesh_local;
  istream *stream_local;
  
  i._3_1_ = needs_swapping;
  _n = mesh;
  mesh_local = (Mesh *)stream;
  read_value<int>(stream,&local_20,needs_swapping);
  for (local_24 = 0; local_24 < local_20; local_24 = local_24 + 1) {
    std::__cxx11::string::string(local_48);
    read((int)mesh_local,local_48,(ulong)(i._3_1_ & 1));
    read_value<int>((istream *)mesh_local,&pair.id,(bool)(i._3_1_ & 1));
    for (pair.dim = 0; pair.dim < pair.id; pair.dim = pair.dim + 1) {
      read_value<int>((istream *)mesh_local,&local_64.dim,(bool)(i._3_1_ & 1));
      read_value<int>((istream *)mesh_local,&local_64.id,(bool)(i._3_1_ & 1));
      this = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](&_n->class_sets,(key_type *)local_48);
      std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>::push_back
                (this,&local_64);
    }
    std::__cxx11::string::~string(local_48);
  }
  return;
}

Assistant:

static void read_sets(std::istream& stream, Mesh* mesh, bool needs_swapping) {
  I32 n;
  read_value(stream, n, needs_swapping);
  for (I32 i = 0; i < n; ++i) {
    std::string name;
    read(stream, name, needs_swapping);
    I32 npairs;
    read_value(stream, npairs, needs_swapping);
    for (I32 j = 0; j < npairs; ++j) {
      ClassPair pair;
      read_value(stream, pair.dim, needs_swapping);
      read_value(stream, pair.id, needs_swapping);
      mesh->class_sets[name].push_back(pair);
    }
  }
}